

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

int64_t __thiscall
icu_63::CollationIterator::nextCEFromCE32
          (CollationIterator *this,CollationData *d,UChar32 c,uint32_t ce32,UErrorCode *errorCode)

{
  int iVar1;
  int64_t iVar2;
  
  (this->ceBuffer).length = (this->ceBuffer).length + -1;
  appendCEsFromCE32(this,d,c,ce32,'\x01',errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = this->cesIndex;
    this->cesIndex = iVar1 + 1;
    iVar2 = (this->ceBuffer).buffer.ptr[iVar1];
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int64_t
CollationIterator::nextCEFromCE32(const CollationData *d, UChar32 c, uint32_t ce32,
                                  UErrorCode &errorCode) {
    --ceBuffer.length;  // Undo ceBuffer.incLength().
    appendCEsFromCE32(d, c, ce32, TRUE, errorCode);
    if(U_SUCCESS(errorCode)) {
        return ceBuffer.get(cesIndex++);
    } else {
        return Collation::NO_CE_PRIMARY;
    }
}